

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  ImGuiWindow *this;
  ImGuiTable *table;
  ImDrawList *draw_list;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 IVar4;
  ImGuiSortDirection sort_direction;
  ImGuiTableColumn *pIVar5;
  int iVar6;
  long lVar7;
  ImGuiTableColumn *column;
  char *pcVar8;
  uint uVar9;
  ImVec2 pos;
  ImVec2 pos_00;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  undefined1 auVar10 [16];
  float fVar11;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ImRect IVar12;
  bool held;
  bool hovered;
  char sort_order_suf [4];
  ImVec2 label_pos;
  ImVec2 label_size;
  ImRect bb;
  bool local_db;
  bool local_da;
  char local_d9;
  uint local_d8;
  char local_d4 [4];
  long local_d0;
  ImVec2 local_c8;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [8];
  uint uStack_b0;
  uint uStack_ac;
  ImVec2 local_a8;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  char *local_70;
  char *local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImRect local_40;
  undefined8 extraout_XMM0_Qb;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems == false) {
    table = GImGui->CurrentTable;
    if (table == (ImGuiTable *)0x0) {
      __assert_fail("table != __null && \"Need to call TableHeader() after BeginTable()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_tables.cpp"
                    ,0xb1d,"void ImGui::TableHeader(const char *)");
    }
    iVar6 = table->CurrentColumn;
    lVar7 = (long)iVar6;
    if (lVar7 == -1) {
      __assert_fail("table->CurrentColumn != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_tables.cpp"
                    ,0xb1e,"void ImGui::TableHeader(const char *)");
    }
    if ((iVar6 < 0) || (column = (table->Columns).Data + lVar7, (table->Columns).DataEnd <= column))
    {
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_internal.h"
                    ,0x238,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    pcVar8 = "";
    if (label != (char *)0x0) {
      pcVar8 = label;
    }
    local_68 = FindRenderedTextEnd(pcVar8,(char *)0x0);
    local_a0 = CalcTextSize(pcVar8,local_68,true,-1.0);
    local_a8 = (this->DC).CursorPos;
    IVar12 = TableGetCellBgRect(table,iVar6);
    local_c8 = IVar12.Min;
    uStack_b0 = in_XMM1_Dc;
    local_b8._0_4_ = IVar12.Max.x;
    local_b8._4_4_ = IVar12.Max.y;
    uStack_ac = in_XMM1_Dd;
    fVar11 = table->RowMinHeight - (table->CellPaddingY + table->CellPaddingY);
    uVar9 = -(uint)(fVar11 <= local_a0.y);
    local_58 = ZEXT416(uVar9 & (uint)local_a0.y | ~uVar9 & (uint)fVar11);
    local_d4[0] = '\0';
    local_d4[1] = '\0';
    local_d4[2] = '\0';
    local_d4[3] = '\0';
    local_88 = ZEXT816(0);
    uStack_c0 = extraout_XMM0_Dc;
    uStack_bc = extraout_XMM0_Dd;
    if (((table->Flags & 8) == 0) || ((column->Flags & 0x100) != 0)) {
      local_98._0_4_ = 0.0;
      local_98._4_4_ = 0;
      local_98._8_4_ = 0;
      local_98._12_4_ = 0;
    }
    else {
      local_98._0_4_ = (undefined4)(int)(pIVar2->FontSize * 0.65 + (pIVar2->Style).FramePadding.x);
      local_98._4_4_ = 0;
      local_98._8_4_ = 0;
      local_98._12_4_ = 0;
      if ('\0' < column->SortOrder) {
        local_98 = ZEXT416((uint)local_98._0_4_);
        ImFormatString(local_d4,4,"%d");
        local_d0 = CONCAT44(local_d0._4_4_,(pIVar2->Style).ItemInnerSpacing.x);
        auVar10._0_8_ = CalcTextSize(local_d4,(char *)0x0,false,-1.0);
        auVar10._8_8_ = extraout_XMM0_Qb;
        local_88._4_12_ = auVar10._4_12_;
        local_88._0_4_ = auVar10._0_4_ + (float)local_d0;
      }
    }
    fVar11 = local_a8.x + local_a0.x + local_88._0_4_ + (float)local_98._0_4_;
    uVar9 = -(uint)(column->WorkMaxX <= column->ContentMaxXHeadersUsed);
    column->ContentMaxXHeadersUsed =
         (float)(~uVar9 & (uint)column->WorkMaxX | (uint)column->ContentMaxXHeadersUsed & uVar9);
    uVar9 = -(uint)(fVar11 <= column->ContentMaxXHeadersIdeal);
    column->ContentMaxXHeadersIdeal =
         (float)(uVar9 & (uint)column->ContentMaxXHeadersIdeal | ~uVar9 & (uint)fVar11);
    if ((table->IsContextPopupOpen == true) && (iVar6 == table->ContextPopupColumn)) {
      local_d8 = (uint)CONCAT11((char)((ushort)table->InstanceInteracted >> 8),
                                table->InstanceInteracted == table->InstanceCurrent);
    }
    else {
      local_d8 = 0;
    }
    local_d0 = lVar7;
    local_70 = pcVar8;
    id = ImGuiWindow::GetID(this,pcVar8,(char *)0x0);
    fVar11 = (pIVar2->Style).CellPadding.y;
    local_40.Min.x = local_c8.x;
    local_40.Min.y = local_c8.y;
    fVar11 = fVar11 + fVar11 + local_c8.y + (float)local_58._0_4_;
    uVar9 = -(uint)(fVar11 <= (float)local_b8._4_4_);
    local_40.Max.y = (float)(uVar9 & local_b8._4_4_ | ~uVar9 & (uint)fVar11);
    local_40.Max.x = (float)local_b8._0_4_;
    local_60.x = 0.0;
    local_60.y = (float)local_58._0_4_;
    ItemSize(&local_60,-1.0);
    bVar3 = ItemAdd(&local_40,id,(ImRect *)0x0,0);
    if (bVar3) {
      local_d9 = ButtonBehavior(&local_40,id,&local_da,&local_db,0x1000);
      if (pIVar2->ActiveId != id) {
        SetItemAllowOverlap();
      }
      lVar7 = local_d0;
      iVar6 = (int)local_d0;
      if (((local_db | local_da | (byte)local_d8) & 1) == 0) {
        if ((table->field_0x98 & 1) == 0) {
          IVar4 = GetColorU32(0x2a,1.0);
          TableSetBgColor(3,IVar4,table->CurrentColumn);
        }
      }
      else {
        uVar9 = 0x1a;
        if (local_db == false) {
          uVar9 = local_da & 1 | 0x18;
        }
        IVar4 = GetColorU32(uVar9,1.0);
        TableSetBgColor(3,IVar4,table->CurrentColumn);
        RenderNavHighlight(&local_40,id,10);
      }
      fVar11 = (float)local_88._0_4_;
      if (local_db == true) {
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)lVar7;
        (this->DC).CursorPos.y = (pIVar2->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
        if ((table->Flags & 2) != 0) {
          bVar3 = IsMouseDragging(0,-1.0);
          fVar11 = (float)local_88._0_4_;
          if ((bVar3) && (pIVar2->DragDropActive == false)) {
            table->ReorderColumn = (ImGuiTableColumnIdx)lVar7;
            table->InstanceInteracted = table->InstanceCurrent;
            pIVar1 = &(pIVar2->IO).MouseDelta;
            if ((pIVar1->x <= 0.0 && pIVar1->x != 0.0) &&
               (pIVar1 = &(pIVar2->IO).MousePos, pIVar1->x <= local_c8.x && local_c8.x != pIVar1->x)
               ) {
              if (column->PrevEnabledColumn == -1) {
                pIVar5 = (ImGuiTableColumn *)0x0;
              }
              else {
                pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                                   (&table->Columns,(int)column->PrevEnabledColumn);
                fVar11 = (float)local_88._0_4_;
              }
              if (((pIVar5 != (ImGuiTableColumn *)0x0) &&
                  (((pIVar5->Flags | column->Flags) & 0x20U) == 0)) &&
                 (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
                  table->FreezeColumnsRequest <= pIVar5->IndexWithinEnabledSet)) {
                table->ReorderColumnDir = -1;
              }
            }
            if ((0.0 < (pIVar2->IO).MouseDelta.x) &&
               ((float)local_b8._0_4_ < (pIVar2->IO).MousePos.x)) {
              if (column->NextEnabledColumn == -1) {
                pIVar5 = (ImGuiTableColumn *)0x0;
              }
              else {
                pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                                   (&table->Columns,(int)column->NextEnabledColumn);
                fVar11 = (float)local_88._0_4_;
              }
              if (((pIVar5 != (ImGuiTableColumn *)0x0) &&
                  (((pIVar5->Flags | column->Flags) & 0x20U) == 0)) &&
                 (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
                  table->FreezeColumnsRequest <= pIVar5->IndexWithinEnabledSet)) {
                table->ReorderColumnDir = '\x01';
              }
            }
          }
        }
      }
      else {
        (this->DC).CursorPos.y = (pIVar2->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
      }
      local_b8._0_4_ = ((float)local_b8._0_4_ - (float)local_98._0_4_) - fVar11;
      if (((table->Flags & 8) != 0) && ((column->Flags & 0x100) == 0)) {
        if (column->SortOrder != -1) {
          uStack_c0 = uStack_b0 & uStack_c0;
          uStack_bc = uStack_ac & uStack_bc;
          local_98 = ZEXT416((uint)local_a8.y);
          local_c8.y = (float)(local_b8._4_4_ & (uint)local_c8.y);
          local_c8.x = (float)(~-(uint)((float)local_b8._0_4_ <= local_c8.x) & local_b8._0_4_ |
                              -(uint)((float)local_b8._0_4_ <= local_c8.x) & (uint)local_c8.x);
          if ('\0' < column->SortOrder) {
            IVar4 = GetColorU32(0,0.7);
            PushStyleColor(0,IVar4);
            pos.x = (pIVar2->Style).ItemInnerSpacing.x + local_c8.x;
            pos.y = (float)local_98._0_4_;
            RenderText(pos,local_d4,(char *)0x0,true);
            PopStyleColor(1);
            local_c8.x = local_c8.x + (float)local_88._0_4_;
          }
          draw_list = this->DrawList;
          IVar4 = GetColorU32(0,1.0);
          pos_00.y = (float)local_98._0_4_;
          pos_00.x = local_c8.x;
          RenderArrow(draw_list,pos_00,IVar4,(column->field_0x64 & 3) == 1 ^ 3,0.65);
          iVar6 = (int)local_d0;
        }
        if ((local_d9 != '\0') && (iVar6 != table->ReorderColumn)) {
          sort_direction = TableGetColumnNextSortDirection(column);
          TableSetColumnSortDirection(iVar6,sort_direction,(pIVar2->IO).KeyShift);
        }
      }
      pcVar8 = local_68;
      local_60.y = local_a8.y + (float)local_58._0_4_ + (pIVar2->Style).FramePadding.y;
      local_60.x = (float)local_b8._0_4_;
      RenderTextEllipsis(this->DrawList,&local_a8,&local_60,(float)local_b8._0_4_,
                         (float)local_b8._0_4_,local_70,local_68,&local_a0);
      if ((((float)local_b8._0_4_ - local_a8.x < local_a0.x) && (local_da == true)) &&
         (pIVar2->TooltipSlowDelay <= pIVar2->HoveredIdNotActiveTimer &&
          pIVar2->HoveredIdNotActiveTimer != pIVar2->TooltipSlowDelay)) {
        SetTooltip("%.*s",(ulong)(uint)((int)pcVar8 - (int)local_70));
      }
      bVar3 = IsMouseReleased(1);
      lVar7 = local_d0;
      if (bVar3) {
        bVar3 = IsItemHovered(0);
        if (bVar3) {
          TableOpenContextMenu((int)lVar7);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}